

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall
QPDFJob::processFile
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,char *filename,
          char *password,bool used_for_input,bool main_input)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = QPDF::processFile;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(char **)((long)local_50._M_unused._0_8_ + 0x10) = filename;
  local_38 = std::
             _Function_handler<void_(QPDF_*,_const_char_*),_std::_Bind<std::_Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)>_(std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(QPDF_*,_const_char_*),_std::_Bind<std::_Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)>_(std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>)>_>
             ::_M_manager;
  doProcess(this,pdf,(function<void_(QPDF_*,_const_char_*)> *)&local_50,password,*filename == '\0',
            used_for_input,main_input);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void
QPDFJob::processFile(
    std::unique_ptr<QPDF>& pdf,
    char const* filename,
    char const* password,
    bool used_for_input,
    bool main_input)
{
    auto f1 = std::mem_fn<void(char const*, char const*)>(&QPDF::processFile);
    auto fn = std::bind(f1, std::placeholders::_1, filename, std::placeholders::_2);
    doProcess(pdf, fn, password, strcmp(filename, "") == 0, used_for_input, main_input);
}